

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::write_ptr<char,fmt::v9::appender,unsigned_long>
                   (appender out,unsigned_long value,basic_format_specs<char> *specs)

{
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar1;
  long lVar2;
  char *pcVar3;
  unsigned_long uVar4;
  buffer<char> *buf;
  ulong uVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  anon_class_16_2_92d121e5 write;
  char buffer [17];
  anon_class_16_2_92d121e5 local_48;
  char local_38 [32];
  
  uVar4 = value;
  lVar7 = 0;
  do {
    lVar6 = lVar7;
    lVar7 = lVar6 + 1;
    bVar8 = 0xf < uVar4;
    uVar4 = uVar4 >> 4;
  } while (bVar8);
  local_48.num_digits = (int)lVar7;
  local_48.value = value;
  if (specs == (basic_format_specs<char> *)0x0) {
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = lVar2 + 1;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x18) < uVar5) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar2 + 1;
    }
    *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container + 0x10
              ) = uVar5;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container + 8)
     + lVar2) = 0x30;
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = lVar2 + 1;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x18) < uVar5) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10);
      uVar5 = lVar2 + 1;
    }
    *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container + 0x10
              ) = uVar5;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container + 8)
     + lVar2) = 0x78;
    lVar2 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 0x10);
    uVar5 = lVar2 + lVar7;
    if (uVar5 <= *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x18)) {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                0x10) = uVar5;
      if (*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                   8) != 0) {
        pcVar3 = (char *)(lVar7 + *(long *)((long)out.
                                                  super_back_insert_iterator<fmt::v9::detail::buffer<char>_>
                                                  .container + 8) + lVar2);
        do {
          pcVar3 = pcVar3 + -1;
          *pcVar3 = "0123456789abcdef"[(uint)value & 0xf];
          bVar8 = 0xf < value;
          value = value >> 4;
        } while (bVar8);
        return (appender)
               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
    }
    pcVar3 = local_38 + lVar6;
    do {
      *pcVar3 = "0123456789abcdef"[(uint)value & 0xf];
      pcVar3 = pcVar3 + -1;
      bVar8 = 0xf < value;
      value = value >> 4;
    } while (bVar8);
    bVar1.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v9::appender>(local_38,local_38 + lVar6 + 1,out);
  }
  else {
    bVar1.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_ptr<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,unsigned_long,fmt::v9::basic_format_specs<char>const*)::_lambda(fmt::v9::appender)_1_&>
                   (out,specs,lVar6 + 3U,lVar6 + 3U,&local_48);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar1.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}